

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O2

void __thiscall pele::physics::pltfilemanager::PltFileManager::readPlotFile(PltFileManager *this)

{
  pointer pMVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  allocator local_95;
  int local_94;
  long local_90;
  long local_88;
  long local_80;
  undefined1 local_78 [32];
  undefined8 uStack_58;
  string local_50;
  
  local_94 = 0;
  lVar5 = 0;
  lVar4 = 0;
  lVar3 = 0;
  local_88 = 0;
  while (local_88 < this->m_nlevels) {
    readLevelBoxArray(this,(int)local_88,
                      (BoxArray *)
                      ((long)&(((this->m_grids).
                                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                      lVar3));
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)local_78,
               (BoxArray *)
               ((long)&(((this->m_grids).
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar3),
               *(int *)(amrex::ParallelContext::frames + 0x10));
    std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this->m_dmaps).
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         .
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
               + lVar4),(__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *
                        )local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    pMVar1 = (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_78._0_8_ = (element_type *)0x1;
    local_78._24_8_ = 0;
    uStack_58 = 0;
    local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78._16_8_ = 0;
    local_50._M_dataplus._M_p = (pointer)&PTR__FabFactory_007d2928;
    local_90 = lVar3;
    local_80 = lVar4;
    (**(code **)(*(long *)((long)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                          lVar5) + 0x10))
              ((long)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar5,
               (long)&(((this->m_grids).
                        super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar3,
               (long)&(((this->m_dmaps).
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        .
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
               + lVar4,this->m_nvars,0,(string *)local_78,&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_78 + 0x10));
    pMVar1 = (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_50,"Cell",&local_95);
    lVar2 = local_88;
    amrex::MultiFabFileFullPrefix
              ((string *)local_78,(int)local_88,&this->m_pltFile,
               (string *)(anonymous_namespace)::level_prefix_abi_cxx11_,&local_50);
    lVar4 = local_80;
    amrex::VisMF::Read((FabArray<amrex::FArrayBox> *)
                       ((long)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar5
                       ),(string *)local_78,(char *)0x0,local_94,0);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&local_50);
    lVar3 = local_90 + 0x68;
    lVar4 = lVar4 + 0x10;
    lVar5 = lVar5 + 0x180;
    local_88 = lVar2 + 1;
  }
  return;
}

Assistant:

void
PltFileManager::readPlotFile()
{
  // Set BoxArray, DistMap on each level and load data
  // TODO: only load a subset of the pltfile variables
  for (int lev = 0; lev < m_nlevels; ++lev) {
    readLevelBoxArray(lev, m_grids[lev]);
    m_dmaps[lev] = DistributionMapping(m_grids[lev]);
    m_data[lev].define(m_grids[lev], m_dmaps[lev], m_nvars, 0);
    VisMF::Read(
      m_data[lev],
      MultiFabFileFullPrefix(lev, m_pltFile, level_prefix, "Cell"));
  }
}